

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Result * __thiscall Catch::clara::detail::Opt::validate(Result *__return_storage_ptr__,Opt *this)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  string local_38;
  
  pbVar2 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"No options supplied to Opt","");
    BasicResult<void>::BasicResult(__return_storage_ptr__,LogicError,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
    do {
      if (pbVar2->_M_string_length == 0) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"Option name cannot be empty","");
        BasicResult<void>::BasicResult(__return_storage_ptr__,LogicError,&local_38);
LAB_00147cff:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        break;
      }
      if (*(pbVar2->_M_dataplus)._M_p != '-') {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"Option name must begin with \'-\'","");
        BasicResult<void>::BasicResult(__return_storage_ptr__,LogicError,&local_38);
        goto LAB_00147cff;
      }
      pbVar2 = pbVar2 + 1;
      bVar3 = pbVar2 == pbVar1;
    } while (!bVar3);
    (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
    (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
         (_func_int **)&PTR__BasicResult_00195648;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

auto validate() const -> Result override {
            if( m_optNames.empty() )
                return Result::logicError( "No options supplied to Opt" );
            for( auto const &name : m_optNames ) {
                if( name.empty() )
                    return Result::logicError( "Option name cannot be empty" );
#ifdef CATCH_PLATFORM_WINDOWS
                if( name[0] != '-' && name[0] != '/' )
                    return Result::logicError( "Option name must begin with '-' or '/'" );
#else
                if( name[0] != '-' )
                    return Result::logicError( "Option name must begin with '-'" );
#endif
            }
            return ParserRefImpl::validate();
        }